

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O3

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  _GLFWjoystick *p_Var3;
  char *pcVar4;
  long lVar5;
  char axisCount;
  char buttonCount;
  int version;
  char name [256];
  char local_13e;
  char local_13d;
  int local_13c;
  char local_138 [264];
  
  lVar5 = 0;
  memset(local_138,0,0x100);
  do {
    if ((*(int *)((long)&_glfw.joysticks[0].present + lVar5) != 0) &&
       (iVar1 = strcmp(*(char **)((long)&_glfw.joysticks[0].linjs.path + lVar5),path), iVar1 == 0))
    {
      return 0;
    }
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x400);
  iVar1 = open(path,0x800);
  if (iVar1 != -1) {
    ioctl(iVar1,0x80046a01,&local_13c);
    if (0xffff < local_13c) {
      iVar2 = ioctl(iVar1,0x81006a13,local_138);
      if (iVar2 < 0) {
        strncpy(local_138,"Unknown",0x100);
      }
      ioctl(iVar1,0x80016a11,&local_13e);
      ioctl(iVar1,0x80016a12,&local_13d);
      p_Var3 = _glfwAllocJoystick(local_138,(int)local_13e,(int)local_13d);
      if (p_Var3 != (_GLFWjoystick *)0x0) {
        pcVar4 = strdup(path);
        (p_Var3->linjs).path = pcVar4;
        (p_Var3->linjs).fd = iVar1;
        _glfwInputJoystick((int)((ulong)&p_Var3[-0x4c3c].buttonCount >> 6),0x40001);
        return 1;
      }
    }
    close(iVar1);
  }
  return 0;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    char axisCount, buttonCount;
    char name[256] = "";
    int jid, fd, version;
    _GLFWjoystick* js;

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].present)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return GLFW_FALSE;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return GLFW_FALSE;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    ioctl(fd, JSIOCGAXES, &axisCount);
    ioctl(fd, JSIOCGBUTTONS, &buttonCount);

    js = _glfwAllocJoystick(name, axisCount, buttonCount);
    if (!js)
    {
        close(fd);
        return GLFW_FALSE;
    }

    js->linjs.path = strdup(path);
    js->linjs.fd = fd;

    _glfwInputJoystick(_GLFW_JOYSTICK_ID(js), GLFW_CONNECTED);
    return GLFW_TRUE;
}